

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper-a64.c
# Opt level: O1

uint32_t helper_rsqrtsf_f16_aarch64(uint32_t a,uint32_t b,void *fpstp)

{
  float16 fVar1;
  float16 b_00;
  uint32_t uVar2;
  
  fVar1 = float16_squash_input_denormal_aarch64((float16)a,(float_status *)fpstp);
  b_00 = float16_squash_input_denormal_aarch64((float16)b,(float_status *)fpstp);
  uVar2 = 0x3e00;
  if (((b_00 & 0x7fff) != 0 || (fVar1 & 0x7fff) != 0x7c00) &&
     ((b_00 & 0x7fff) != 0x7c00 || (fVar1 & 0x7fff) != 0)) {
    fVar1 = float16_muladd_aarch64(fVar1 ^ 0x8000,b_00,0x4200,8,(float_status *)fpstp);
    uVar2 = (uint32_t)fVar1;
  }
  return uVar2;
}

Assistant:

uint32_t HELPER(rsqrtsf_f16)(uint32_t a, uint32_t b, void *fpstp)
{
    float_status *fpst = fpstp;

    a = float16_squash_input_denormal(a, fpst);
    b = float16_squash_input_denormal(b, fpst);

    a = float16_chs(a);
    if ((float16_is_infinity(a) && float16_is_zero(b)) ||
        (float16_is_infinity(b) && float16_is_zero(a))) {
        return float16_one_point_five;
    }
    return float16_muladd(a, b, float16_three, float_muladd_halve_result, fpst);
}